

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error doContent(XML_Parser parser,int startTagLevel,ENCODING *enc,char *s,char *end,
                   char **nextPtr,XML_Bool haveMore)

{
  XML_Char XVar1;
  XML_Parsing XVar2;
  int iVar3;
  DTD *table;
  XML_DefaultHandler p_Var4;
  binding *pbVar5;
  DTD *pDVar6;
  XML_Bool XVar7;
  int iVar8;
  XML_Convert_Result XVar9;
  XML_Error XVar10;
  char *pcVar11;
  XML_CharacterDataHandler p_Var12;
  TAG *pTVar13;
  char *pcVar14;
  XML_Char *pXVar15;
  ENTITY *pEVar16;
  XML_EndElementHandler p_Var17;
  NAMED *pNVar18;
  OPEN_INTERNAL_ENTITY *pOVar19;
  char cVar20;
  BINDING *pBVar21;
  long lVar22;
  BINDING *b;
  size_t sVar23;
  BINDING *pBVar24;
  TAG_NAME *pTVar25;
  void *pvVar26;
  ulong uVar27;
  uint uVar28;
  char *pcVar29;
  OPEN_INTERNAL_ENTITY *pOVar30;
  bool bVar31;
  TAG_NAME *local_c0;
  char *next;
  OPEN_INTERNAL_ENTITY *local_b0;
  TAG_NAME *local_a8;
  STRING_POOL *local_a0;
  int local_94;
  char **local_90;
  char *fromPtr;
  ENTITY *local_80;
  char **local_78;
  TAG_NAME name;
  
  table = parser->m_dtd;
  if (parser->m_encoding == enc) {
    pOVar30 = (OPEN_INTERNAL_ENTITY *)&parser->m_eventPtr;
    local_78 = &parser->m_eventEndPtr;
  }
  else {
    pOVar30 = parser->m_openInternalEntities;
    local_78 = &pOVar30->internalEventEndPtr;
  }
  pOVar30->internalEventPtr = s;
  local_a0 = &parser->m_tempPool;
  local_c0 = (TAG_NAME *)s;
  local_b0 = pOVar30;
  local_a8 = (TAG_NAME *)end;
  local_94 = startTagLevel;
  local_90 = nextPtr;
  do {
    next = (char *)local_c0;
    iVar8 = (*enc->scanners[1])(enc,(char *)local_c0,(char *)local_a8,&next);
    *local_78 = next;
    switch(iVar8) {
    case 0:
      pOVar30->internalEventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case 1:
    case 2:
      pTVar13 = parser->m_freeTagList;
      if (pTVar13 == (TAG *)0x0) {
        pTVar13 = (TAG *)(*(parser->m_mem).malloc_fcn)(0x58);
        if (pTVar13 == (TAG *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        pcVar29 = (char *)(*(parser->m_mem).malloc_fcn)(0x20);
        pTVar13->buf = pcVar29;
        if (pcVar29 == (char *)0x0) {
          (*(parser->m_mem).free_fcn)(pTVar13);
          return XML_ERROR_NO_MEMORY;
        }
        pTVar13->bufEnd = pcVar29 + 0x20;
      }
      else {
        parser->m_freeTagList = pTVar13->parent;
      }
      pTVar13->bindings = (BINDING *)0x0;
      pTVar13->parent = parser->m_tagStack;
      parser->m_tagStack = pTVar13;
      local_80 = (ENTITY *)&pTVar13->name;
      (pTVar13->name).localPart = (XML_Char *)0x0;
      (pTVar13->name).prefix = (XML_Char *)0x0;
      pcVar29 = (char *)((long)&local_c0->str + (long)enc->minBytesPerChar);
      pTVar13->rawName = pcVar29;
      iVar8 = (*enc->nameLength)(enc,pcVar29);
      pTVar13->rawNameLength = iVar8;
      parser->m_tagLevel = parser->m_tagLevel + 1;
      fromPtr = pTVar13->rawName;
      pcVar11 = fromPtr + iVar8;
      name.str = pTVar13->buf;
      pcVar29 = pTVar13->bufEnd;
      while( true ) {
        XVar9 = (*enc->utf8Convert)(enc,&fromPtr,pcVar11,&name.str,pcVar29 + -1);
        pEVar16 = local_80;
        pcVar29 = pTVar13->buf;
        iVar8 = (int)name.str - (int)pcVar29;
        if ((pcVar11 <= fromPtr) || (XVar9 == XML_CONVERT_INPUT_INCOMPLETE)) break;
        sVar23 = (size_t)((*(int *)&pTVar13->bufEnd - (int)pcVar29) * 2);
        pcVar14 = (char *)(*(parser->m_mem).realloc_fcn)(pcVar29,sVar23);
        if (pcVar14 == (char *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        pTVar13->buf = pcVar14;
        pcVar29 = pcVar14 + sVar23;
        pTVar13->bufEnd = pcVar29;
        name.str = pcVar14 + iVar8;
      }
      (pTVar13->name).strLen = iVar8;
      (pTVar13->name).str = pcVar29;
      *name.str = '\0';
      XVar10 = storeAtts(parser,enc,(char *)local_c0,(TAG_NAME *)local_80,&pTVar13->bindings);
      nextPtr = local_90;
      pOVar30 = local_b0;
      if (XVar10 != XML_ERROR_NONE) {
        return XVar10;
      }
      if (parser->m_startElementHandler == (XML_StartElementHandler)0x0) {
        if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(parser,enc,(char *)local_c0,next);
        }
      }
      else {
        (*parser->m_startElementHandler)(parser->m_handlerArg,pEVar16->name,&parser->m_atts->name);
        nextPtr = local_90;
        pOVar30 = local_b0;
      }
      poolClear(local_a0);
      break;
    case 3:
    case 4:
      pcVar29 = (char *)((long)&local_c0->str + (long)enc->minBytesPerChar);
      fromPtr = (char *)0x0;
      iVar8 = (*enc->nameLength)(enc,pcVar29);
      name.str = poolStoreString(local_a0,enc,pcVar29,pcVar29 + iVar8);
      if (name.str == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      (parser->m_tempPool).start = (parser->m_tempPool).ptr;
      XVar10 = storeAtts(parser,enc,(char *)local_c0,&name,(BINDING **)&fromPtr);
      if (XVar10 != XML_ERROR_NONE) {
        freeBindings(parser,(BINDING *)fromPtr);
        return XVar10;
      }
      (parser->m_tempPool).start = (parser->m_tempPool).ptr;
      if (parser->m_startElementHandler == (XML_StartElementHandler)0x0) {
        p_Var17 = parser->m_endElementHandler;
        if (p_Var17 != (XML_EndElementHandler)0x0) goto LAB_00344ea1;
        if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(parser,enc,(char *)local_c0,next);
        }
      }
      else {
        (*parser->m_startElementHandler)(parser->m_handlerArg,name.str,&parser->m_atts->name);
        p_Var17 = parser->m_endElementHandler;
        if (p_Var17 != (XML_EndElementHandler)0x0) {
          if (parser->m_startElementHandler != (XML_StartElementHandler)0x0) {
            pOVar30->internalEventPtr = *local_78;
            p_Var17 = parser->m_endElementHandler;
          }
LAB_00344ea1:
          (*p_Var17)(parser->m_handlerArg,name.str);
        }
      }
      poolClear(local_a0);
      freeBindings(parser,(BINDING *)fromPtr);
      if (parser->m_tagLevel == 0) {
        XVar2 = (parser->m_parsingStatus).parsing;
        if (XVar2 != XML_SUSPENDED) {
          if (XVar2 == XML_FINISHED) {
            pOVar30->internalEventPtr = next;
            return XML_ERROR_ABORTED;
          }
LAB_0034573c:
          XVar10 = epilogProcessor(parser,next,(char *)local_a8,nextPtr);
          return XVar10;
        }
        parser->m_processor = epilogProcessor;
        pOVar30->internalEventPtr = next;
        local_c0 = (TAG_NAME *)next;
        goto LAB_00345836;
      }
      break;
    case 5:
      if (parser->m_tagLevel == local_94) {
        return XML_ERROR_ASYNC_ENTITY;
      }
      pTVar13 = parser->m_tagStack;
      parser->m_tagStack = pTVar13->parent;
      pTVar13->parent = parser->m_freeTagList;
      parser->m_freeTagList = pTVar13;
      pcVar29 = (char *)((long)&local_c0->str + (long)enc->minBytesPerChar * 2);
      iVar8 = (*enc->nameLength)(enc,pcVar29);
      if ((iVar8 != pTVar13->rawNameLength) ||
         (iVar8 = bcmp(pTVar13->rawName,pcVar29,(long)iVar8), iVar8 != 0)) {
        local_b0->internalEventPtr = pcVar29;
        return XML_ERROR_TAG_MISMATCH;
      }
      parser->m_tagLevel = parser->m_tagLevel + -1;
      p_Var17 = parser->m_endElementHandler;
      if (p_Var17 == (XML_EndElementHandler)0x0) {
        if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(parser,enc,(char *)local_c0,next);
        }
      }
      else {
        pcVar29 = (pTVar13->name).localPart;
        if (pcVar29 != (char *)0x0 && parser->m_ns != '\0') {
          pcVar11 = (pTVar13->name).str + (pTVar13->name).uriLen;
          for (; *pcVar29 != '\0'; pcVar29 = pcVar29 + 1) {
            *pcVar11 = *pcVar29;
            pcVar11 = pcVar11 + 1;
          }
          pXVar15 = (pTVar13->name).prefix;
          if (pXVar15 != (XML_Char *)0x0 && parser->m_ns_triplets != '\0') {
            *pcVar11 = parser->m_namespaceSeparator;
            for (lVar22 = 1; cVar20 = pXVar15[lVar22 + -1], cVar20 != '\0'; lVar22 = lVar22 + 1) {
              pcVar11[lVar22] = cVar20;
            }
            pcVar11 = pcVar11 + lVar22;
          }
          *pcVar11 = '\0';
          p_Var17 = parser->m_endElementHandler;
        }
        (*p_Var17)(parser->m_handlerArg,(pTVar13->name).str);
      }
      pBVar24 = pTVar13->bindings;
      while (pBVar24 != (BINDING *)0x0) {
        pBVar21 = pBVar24;
        if (parser->m_endNamespaceDeclHandler != (XML_EndNamespaceDeclHandler)0x0) {
          (*parser->m_endNamespaceDeclHandler)(parser->m_handlerArg,pBVar24->prefix->name);
          pBVar21 = pTVar13->bindings;
        }
        pbVar5 = pBVar21->nextTagBinding;
        pTVar13->bindings = pbVar5;
        pBVar24->nextTagBinding = parser->m_freeBindingList;
        parser->m_freeBindingList = pBVar24;
        pBVar24->prefix->binding = pBVar24->prevPrefixBinding;
        pBVar24 = pbVar5;
      }
      pOVar30 = local_b0;
      if (parser->m_tagLevel == 0) goto LAB_0034573c;
      break;
    case 6:
      p_Var12 = parser->m_characterDataHandler;
      if (p_Var12 == (XML_CharacterDataHandler)0x0) {
        pOVar30 = local_b0;
        if (parser->m_defaultHandler == (XML_DefaultHandler)0x0) break;
LAB_003452e1:
        reportDefault(parser,enc,(char *)local_c0,next);
      }
      else {
        if (enc->isUtf8 != '\0') {
          pvVar26 = parser->m_handlerArg;
          iVar8 = (int)next - (int)local_c0;
          pTVar25 = local_c0;
          goto LAB_00344c5d;
        }
        while( true ) {
          name.str = parser->m_dataBuf;
          XVar9 = (*enc->utf8Convert)(enc,(char **)&local_c0,next,&name.str,parser->m_dataBufEnd);
          *local_78 = (char *)local_c0;
          (*p_Var12)(parser->m_handlerArg,parser->m_dataBuf,(int)name.str - (int)parser->m_dataBuf);
          pOVar30 = local_b0;
          if (XVar9 < XML_CONVERT_OUTPUT_EXHAUSTED) break;
          local_b0->internalEventPtr = (char *)local_c0;
        }
      }
      break;
    case 7:
      p_Var12 = parser->m_characterDataHandler;
      if (p_Var12 == (XML_CharacterDataHandler)0x0) goto switchD_003449c8_default;
      name.str = (XML_Char *)CONCAT71(name.str._1_7_,10);
      pvVar26 = parser->m_handlerArg;
      pTVar25 = &name;
LAB_00344d0a:
      (*p_Var12)(pvVar26,(XML_Char *)pTVar25,1);
      break;
    case 8:
      if (parser->m_startCdataSectionHandler == (XML_StartCdataSectionHandler)0x0) {
        if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(parser,enc,(char *)local_c0,next);
        }
      }
      else {
        (*parser->m_startCdataSectionHandler)(parser->m_handlerArg);
      }
      XVar10 = doCdataSection(parser,enc,&next,(char *)local_a8,nextPtr,haveMore);
      if (XVar10 != XML_ERROR_NONE) {
        return XVar10;
      }
      if (next == (char *)0x0) {
        parser->m_processor = cdataSectionProcessor;
        return XML_ERROR_NONE;
      }
      break;
    case 9:
      iVar8 = (*enc->predefinedEntityName)
                        (enc,(char *)((long)&local_c0->str + (long)enc->minBytesPerChar),
                         next + -(long)enc->minBytesPerChar);
      fromPtr = (char *)CONCAT71(fromPtr._1_7_,(char)iVar8);
      if ((char)iVar8 != '\0') {
        p_Var12 = parser->m_characterDataHandler;
        if (p_Var12 == (XML_CharacterDataHandler)0x0) {
          p_Var4 = parser->m_defaultHandler;
          goto joined_r0x00345109;
        }
        pvVar26 = parser->m_handlerArg;
        pTVar25 = (TAG_NAME *)&fromPtr;
        goto LAB_00344d0a;
      }
      pXVar15 = poolStoreString(&table->pool,enc,
                                (char *)((long)&local_c0->str + (long)enc->minBytesPerChar),
                                next + -(long)enc->minBytesPerChar);
      if (pXVar15 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      pEVar16 = (ENTITY *)lookup(parser,&table->generalEntities,pXVar15,0);
      nextPtr = local_90;
      (table->pool).ptr = (table->pool).start;
      if ((table->hasParamEntityRefs == '\0') || (table->standalone != '\0')) {
        if (pEVar16 == (ENTITY *)0x0) {
          return XML_ERROR_UNDEFINED_ENTITY;
        }
        if (pEVar16->is_internal == '\0') {
          return XML_ERROR_ENTITY_DECLARED_IN_PE;
        }
      }
      else if (pEVar16 == (ENTITY *)0x0) {
        if (parser->m_skippedEntityHandler == (XML_SkippedEntityHandler)0x0) {
          p_Var4 = parser->m_defaultHandler;
          goto joined_r0x00345109;
        }
        (*parser->m_skippedEntityHandler)(parser->m_handlerArg,pXVar15,0);
        nextPtr = local_90;
        break;
      }
      if (pEVar16->open != '\0') {
        return XML_ERROR_RECURSIVE_ENTITY_REF;
      }
      if (pEVar16->notation != (XML_Char *)0x0) {
        return XML_ERROR_BINARY_ENTITY_REF;
      }
      pcVar29 = pEVar16->textPtr;
      if (pcVar29 == (char *)0x0) {
        if (parser->m_externalEntityRefHandler == (XML_ExternalEntityRefHandler)0x0) {
LAB_003452c8:
          p_Var4 = parser->m_defaultHandler;
          goto joined_r0x00345109;
        }
        pEVar16->open = '\x01';
        pDVar6 = parser->m_dtd;
        bVar31 = (pDVar6->defaultPrefix).binding == (BINDING *)0x0;
        local_80 = pEVar16;
        if (!bVar31) {
          pXVar15 = (parser->m_tempPool).ptr;
          if (pXVar15 == (parser->m_tempPool).end) {
            XVar7 = poolGrow(local_a0);
            if (XVar7 == '\0') goto LAB_00345756;
            pXVar15 = (parser->m_tempPool).ptr;
          }
          (parser->m_tempPool).ptr = pXVar15 + 1;
          *pXVar15 = '=';
          uVar28 = ((pDVar6->defaultPrefix).binding)->uriLen + -1 +
                   (uint)(parser->m_namespaceSeparator == '\0');
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          for (uVar27 = 0; uVar28 != uVar27; uVar27 = uVar27 + 1) {
            pXVar15 = (parser->m_tempPool).ptr;
            if (pXVar15 == (parser->m_tempPool).end) {
              XVar7 = poolGrow(local_a0);
              if (XVar7 == '\0') goto LAB_00345756;
              pXVar15 = (parser->m_tempPool).ptr;
            }
            XVar1 = ((pDVar6->defaultPrefix).binding)->uri[uVar27];
            (parser->m_tempPool).ptr = pXVar15 + 1;
            *pXVar15 = XVar1;
          }
        }
        name.str = (XML_Char *)(pDVar6->prefixes).v;
        name.localPart = (XML_Char *)((long)name.str + (pDVar6->prefixes).size * 8);
        while (pNVar18 = hashTableIterNext((HASH_TABLE_ITER *)&name), pNVar18 != (NAMED *)0x0) {
          if (pNVar18[1].name != (KEY)0x0) {
            if (!bVar31) {
              pXVar15 = (parser->m_tempPool).ptr;
              if (pXVar15 == (parser->m_tempPool).end) {
                XVar7 = poolGrow(local_a0);
                if (XVar7 == '\0') goto LAB_00345756;
                pXVar15 = (parser->m_tempPool).ptr;
              }
              (parser->m_tempPool).ptr = pXVar15 + 1;
              *pXVar15 = '\f';
            }
            pcVar29 = pNVar18->name;
            while( true ) {
              cVar20 = *pcVar29;
              pcVar11 = (parser->m_tempPool).end;
              pcVar14 = (parser->m_tempPool).ptr;
              if (cVar20 == '\0') break;
              if (pcVar14 == pcVar11) {
                XVar7 = poolGrow(local_a0);
                if (XVar7 == '\0') goto LAB_00345756;
                cVar20 = *pcVar29;
                pcVar14 = (parser->m_tempPool).ptr;
              }
              (parser->m_tempPool).ptr = pcVar14 + 1;
              *pcVar14 = cVar20;
              pcVar29 = pcVar29 + 1;
            }
            if (pcVar14 == pcVar11) {
              XVar7 = poolGrow(local_a0);
              if (XVar7 == '\0') goto LAB_00345756;
              pcVar14 = (parser->m_tempPool).ptr;
            }
            (parser->m_tempPool).ptr = pcVar14 + 1;
            *pcVar14 = '=';
            uVar28 = *(int *)(pNVar18[1].name + 0x28) + -1 +
                     (uint)(parser->m_namespaceSeparator == '\0');
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            for (uVar27 = 0; uVar28 != uVar27; uVar27 = uVar27 + 1) {
              pXVar15 = (parser->m_tempPool).ptr;
              if (pXVar15 == (parser->m_tempPool).end) {
                XVar7 = poolGrow(local_a0);
                if (XVar7 == '\0') goto LAB_00345756;
                pXVar15 = (parser->m_tempPool).ptr;
              }
              XVar1 = *(XML_Char *)(*(long *)(pNVar18[1].name + 0x20) + uVar27);
              (parser->m_tempPool).ptr = pXVar15 + 1;
              *pXVar15 = XVar1;
            }
            bVar31 = false;
          }
        }
        name.str = (XML_Char *)(pDVar6->generalEntities).v;
        name.localPart = (XML_Char *)((long)name.str + (pDVar6->generalEntities).size * 8);
        pOVar30 = local_b0;
        while (pNVar18 = hashTableIterNext((HASH_TABLE_ITER *)&name), pNVar18 != (NAMED *)0x0) {
          if (*(char *)&pNVar18[7].name != '\0') {
            if (!bVar31) {
              pXVar15 = (parser->m_tempPool).ptr;
              if (pXVar15 == (parser->m_tempPool).end) {
                XVar7 = poolGrow(local_a0);
                if (XVar7 == '\0') goto LAB_00345756;
                pXVar15 = (parser->m_tempPool).ptr;
                pOVar30 = local_b0;
              }
              (parser->m_tempPool).ptr = pXVar15 + 1;
              *pXVar15 = '\f';
            }
            for (pcVar29 = pNVar18->name; cVar20 = *pcVar29, cVar20 != '\0'; pcVar29 = pcVar29 + 1)
            {
              pcVar11 = (parser->m_tempPool).ptr;
              if (pcVar11 == (parser->m_tempPool).end) {
                XVar7 = poolGrow(local_a0);
                if (XVar7 == '\0') goto LAB_00345756;
                cVar20 = *pcVar29;
                pcVar11 = (parser->m_tempPool).ptr;
                pOVar30 = local_b0;
              }
              (parser->m_tempPool).ptr = pcVar11 + 1;
              *pcVar11 = cVar20;
            }
            bVar31 = false;
          }
        }
        pXVar15 = (parser->m_tempPool).ptr;
        if (pXVar15 == (parser->m_tempPool).end) {
          XVar7 = poolGrow(local_a0);
          if (XVar7 == '\0') {
LAB_00345756:
            local_80->open = '\0';
            return XML_ERROR_NO_MEMORY;
          }
          pXVar15 = (parser->m_tempPool).ptr;
          pOVar30 = local_b0;
        }
        (parser->m_tempPool).ptr = pXVar15 + 1;
        *pXVar15 = '\0';
        pXVar15 = (parser->m_tempPool).start;
        local_80->open = '\0';
        if (pXVar15 == (XML_Char *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        iVar8 = (*parser->m_externalEntityRefHandler)
                          (parser->m_externalEntityRefHandlerArg,pXVar15,local_80->base,
                           local_80->systemId,local_80->publicId);
        if (iVar8 == 0) {
          return XML_ERROR_EXTERNAL_ENTITY_HANDLING;
        }
        (parser->m_tempPool).ptr = (parser->m_tempPool).start;
        nextPtr = local_90;
      }
      else if (parser->m_defaultExpandInternalEntities == '\0') {
        if (parser->m_skippedEntityHandler == (XML_SkippedEntityHandler)0x0) goto LAB_003452c8;
        (*parser->m_skippedEntityHandler)(parser->m_handlerArg,pEVar16->name,0);
      }
      else {
        pOVar19 = parser->m_freeInternalEntities;
        if (pOVar19 == (OPEN_INTERNAL_ENTITY *)0x0) {
          pOVar19 = (OPEN_INTERNAL_ENTITY *)(*(parser->m_mem).malloc_fcn)(0x28);
          if (pOVar19 == (OPEN_INTERNAL_ENTITY *)0x0) {
            return XML_ERROR_NO_MEMORY;
          }
          pcVar29 = pEVar16->textPtr;
        }
        else {
          parser->m_freeInternalEntities = pOVar19->next;
        }
        pEVar16->open = '\x01';
        pEVar16->processed = 0;
        pOVar19->next = parser->m_openInternalEntities;
        parser->m_openInternalEntities = pOVar19;
        pOVar19->entity = pEVar16;
        iVar8 = parser->m_tagLevel;
        pOVar19->startTagLevel = iVar8;
        pOVar19->betweenDecl = '\0';
        pOVar19->internalEventPtr = (char *)0x0;
        pOVar19->internalEventEndPtr = (char *)0x0;
        iVar3 = pEVar16->textLen;
        local_80 = pEVar16;
        name.str = pcVar29;
        XVar10 = doContent(parser,iVar8,parser->m_internalEncoding,pcVar29,pcVar29 + iVar3,&name.str
                           ,'\0');
        if (XVar10 != XML_ERROR_NONE) {
          return XVar10;
        }
        pOVar30 = local_b0;
        if ((pcVar29 + iVar3 == name.str) || ((parser->m_parsingStatus).parsing != XML_SUSPENDED)) {
          local_80->open = '\0';
          parser->m_openInternalEntities = pOVar19->next;
          pOVar19->next = parser->m_freeInternalEntities;
          parser->m_freeInternalEntities = pOVar19;
        }
        else {
          local_80->processed = (int)name.str - (int)pcVar29;
          parser->m_processor = internalEntityProcessor;
        }
      }
      break;
    case 10:
      iVar8 = (*enc->charRefNumber)(enc,(char *)local_c0);
      if (iVar8 < 0) {
        return XML_ERROR_BAD_CHAR_REF;
      }
      p_Var12 = parser->m_characterDataHandler;
      if (p_Var12 == (XML_CharacterDataHandler)0x0) {
        p_Var4 = parser->m_defaultHandler;
        pOVar30 = local_b0;
        goto joined_r0x00345109;
      }
      pvVar26 = parser->m_handlerArg;
      iVar8 = XmlUtf8Encode(iVar8,(char *)&name);
      nextPtr = local_90;
      pTVar25 = &name;
LAB_00344c5d:
      (*p_Var12)(pvVar26,(XML_Char *)pTVar25,iVar8);
      pOVar30 = local_b0;
      break;
    case 0xb:
      iVar8 = reportProcessingInstruction(parser,enc,(char *)local_c0,next);
      goto LAB_00344c2f;
    case 0xc:
      return XML_ERROR_MISPLACED_XML_PI;
    case 0xd:
      iVar8 = reportComment(parser,enc,(char *)local_c0,next);
LAB_00344c2f:
      if (iVar8 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case -5:
      if (haveMore == '\0') {
        if (parser->m_characterDataHandler == (XML_CharacterDataHandler)0x0) {
          if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
            reportDefault(parser,enc,(char *)local_c0,(char *)local_a8);
          }
        }
        else if (enc->isUtf8 == '\0') {
          name.str = parser->m_dataBuf;
          (*enc->utf8Convert)(enc,(char **)&local_c0,(char *)local_a8,&name.str,parser->m_dataBufEnd
                             );
          (*parser->m_characterDataHandler)
                    (parser->m_handlerArg,parser->m_dataBuf,(int)name.str - (int)parser->m_dataBuf);
        }
        else {
          (*parser->m_characterDataHandler)
                    (parser->m_handlerArg,(XML_Char *)local_c0,(int)local_a8 - (int)local_c0);
        }
        if (local_94 == 0) {
          pOVar30->internalEventPtr = (char *)local_a8;
          return XML_ERROR_NO_ELEMENTS;
        }
        local_c0 = local_a8;
        if (parser->m_tagLevel != local_94) {
          pOVar30->internalEventPtr = (char *)local_a8;
          return XML_ERROR_ASYNC_ENTITY;
        }
      }
      goto LAB_00345836;
    case -4:
      if (haveMore == '\0') {
        if (local_94 < 1) {
          return XML_ERROR_NO_ELEMENTS;
        }
        if (parser->m_tagLevel != local_94) {
          return XML_ERROR_ASYNC_ENTITY;
        }
      }
      goto LAB_00345836;
    case -3:
      if (haveMore == '\0') {
        *local_78 = (char *)local_a8;
        if (parser->m_characterDataHandler == (XML_CharacterDataHandler)0x0) {
          if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
            reportDefault(parser,enc,(char *)local_c0,(char *)local_a8);
          }
        }
        else {
          name.str = (XML_Char *)CONCAT71(name.str._1_7_,10);
          (*parser->m_characterDataHandler)(parser->m_handlerArg,(XML_Char *)&name,1);
        }
        if (local_94 == 0) {
          return XML_ERROR_NO_ELEMENTS;
        }
        local_c0 = local_a8;
        if (parser->m_tagLevel != local_94) {
          return XML_ERROR_ASYNC_ENTITY;
        }
      }
      goto LAB_00345836;
    case -2:
      if (haveMore == '\0') {
        return XML_ERROR_PARTIAL_CHAR;
      }
      goto LAB_00345836;
    case -1:
      if (haveMore == '\0') {
        return XML_ERROR_UNCLOSED_TOKEN;
      }
      goto LAB_00345836;
    default:
switchD_003449c8_default:
      p_Var4 = parser->m_defaultHandler;
joined_r0x00345109:
      if (p_Var4 != (XML_DefaultHandler)0x0) goto LAB_003452e1;
    }
    XVar2 = (parser->m_parsingStatus).parsing;
    local_c0 = (TAG_NAME *)next;
    pOVar30->internalEventPtr = next;
    if (XVar2 == XML_FINISHED) {
      return XML_ERROR_ABORTED;
    }
    if (XVar2 == XML_SUSPENDED) {
LAB_00345836:
      *nextPtr = (char *)local_c0;
      return XML_ERROR_NONE;
    }
  } while( true );
}

Assistant:

static enum XML_Error
doContent(XML_Parser parser,
          int startTagLevel,
          const ENCODING *enc,
          const char *s,
          const char *end,
          const char **nextPtr,
          XML_Bool haveMore)
{
  /* save one level of indirection */
  DTD * const dtd = parser->m_dtd;

  const char **eventPP;
  const char **eventEndPP;
  if (enc == parser->m_encoding) {
    eventPP = &parser->m_eventPtr;
    eventEndPP = &parser->m_eventEndPtr;
  }
  else {
    eventPP = &(parser->m_openInternalEntities->internalEventPtr);
    eventEndPP = &(parser->m_openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;

  for (;;) {
    const char *next = s; /* XmlContentTok doesn't always set the last arg */
    int tok = XmlContentTok(enc, s, end, &next);
    *eventEndPP = next;
    switch (tok) {
    case XML_TOK_TRAILING_CR:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      *eventEndPP = end;
      if (parser->m_characterDataHandler) {
        XML_Char c = 0xA;
        parser->m_characterDataHandler(parser->m_handlerArg, &c, 1);
      }
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, end);
      /* We are at the end of the final buffer, should we check for
         XML_SUSPENDED, XML_FINISHED?
      */
      if (startTagLevel == 0)
        return XML_ERROR_NO_ELEMENTS;
      if (parser->m_tagLevel != startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      *nextPtr = end;
      return XML_ERROR_NONE;
    case XML_TOK_NONE:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (startTagLevel > 0) {
        if (parser->m_tagLevel != startTagLevel)
          return XML_ERROR_ASYNC_ENTITY;
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_NO_ELEMENTS;
    case XML_TOK_INVALID:
      *eventPP = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        XML_Char ch = (XML_Char) XmlPredefinedEntityName(enc,
                                              s + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (parser->m_characterDataHandler)
            parser->m_characterDataHandler(parser->m_handlerArg, &ch, 1);
          else if (parser->m_defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        name = poolStoreString(&dtd->pool, enc,
                                s + enc->minBytesPerChar,
                                next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(parser, &dtd->generalEntities, name, 0);
        poolDiscard(&dtd->pool);
        /* First, determine if a check for an existing declaration is needed;
           if yes, check that the entity exists, and that it is internal,
           otherwise call the skipped entity or default handler.
        */
        if (!dtd->hasParamEntityRefs || dtd->standalone) {
          if (!entity)
            return XML_ERROR_UNDEFINED_ENTITY;
          else if (!entity->is_internal)
            return XML_ERROR_ENTITY_DECLARED_IN_PE;
        }
        else if (!entity) {
          if (parser->m_skippedEntityHandler)
            parser->m_skippedEntityHandler(parser->m_handlerArg, name, 0);
          else if (parser->m_defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        if (entity->open)
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        if (entity->notation)
          return XML_ERROR_BINARY_ENTITY_REF;
        if (entity->textPtr) {
          enum XML_Error result;
          if (!parser->m_defaultExpandInternalEntities) {
            if (parser->m_skippedEntityHandler)
              parser->m_skippedEntityHandler(parser->m_handlerArg, entity->name, 0);
            else if (parser->m_defaultHandler)
              reportDefault(parser, enc, s, next);
            break;
          }
          result = processInternalEntity(parser, entity, XML_FALSE);
          if (result != XML_ERROR_NONE)
            return result;
        }
        else if (parser->m_externalEntityRefHandler) {
          const XML_Char *context;
          entity->open = XML_TRUE;
          context = getContext(parser);
          entity->open = XML_FALSE;
          if (!context)
            return XML_ERROR_NO_MEMORY;
          if (!parser->m_externalEntityRefHandler(parser->m_externalEntityRefHandlerArg,
                                        context,
                                        entity->base,
                                        entity->systemId,
                                        entity->publicId))
            return XML_ERROR_EXTERNAL_ENTITY_HANDLING;
          poolDiscard(&parser->m_tempPool);
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        break;
      }
    case XML_TOK_START_TAG_NO_ATTS:
      /* fall through */
    case XML_TOK_START_TAG_WITH_ATTS:
      {
        TAG *tag;
        enum XML_Error result;
        XML_Char *toPtr;
        if (parser->m_freeTagList) {
          tag = parser->m_freeTagList;
          parser->m_freeTagList = parser->m_freeTagList->parent;
        }
        else {
          tag = (TAG *)MALLOC(parser, sizeof(TAG));
          if (!tag)
            return XML_ERROR_NO_MEMORY;
          tag->buf = (char *)MALLOC(parser, INIT_TAG_BUF_SIZE);
          if (!tag->buf) {
            FREE(parser, tag);
            return XML_ERROR_NO_MEMORY;
          }
          tag->bufEnd = tag->buf + INIT_TAG_BUF_SIZE;
        }
        tag->bindings = NULL;
        tag->parent = parser->m_tagStack;
        parser->m_tagStack = tag;
        tag->name.localPart = NULL;
        tag->name.prefix = NULL;
        tag->rawName = s + enc->minBytesPerChar;
        tag->rawNameLength = XmlNameLength(enc, tag->rawName);
        ++parser->m_tagLevel;
        {
          const char *rawNameEnd = tag->rawName + tag->rawNameLength;
          const char *fromPtr = tag->rawName;
          toPtr = (XML_Char *)tag->buf;
          for (;;) {
            int bufSize;
            int convLen;
            const enum XML_Convert_Result convert_res = XmlConvert(enc,
                       &fromPtr, rawNameEnd,
                       (ICHAR **)&toPtr, (ICHAR *)tag->bufEnd - 1);
            convLen = (int)(toPtr - (XML_Char *)tag->buf);
            if ((fromPtr >= rawNameEnd) || (convert_res == XML_CONVERT_INPUT_INCOMPLETE)) {
              tag->name.strLen = convLen;
              break;
            }
            bufSize = (int)(tag->bufEnd - tag->buf) << 1;
            {
              char *temp = (char *)REALLOC(parser, tag->buf, bufSize);
              if (temp == NULL)
                return XML_ERROR_NO_MEMORY;
              tag->buf = temp;
              tag->bufEnd = temp + bufSize;
              toPtr = (XML_Char *)temp + convLen;
            }
          }
        }
        tag->name.str = (XML_Char *)tag->buf;
        *toPtr = XML_T('\0');
        result = storeAtts(parser, enc, s, &(tag->name), &(tag->bindings));
        if (result)
          return result;
        if (parser->m_startElementHandler)
          parser->m_startElementHandler(parser->m_handlerArg, tag->name.str,
                              (const XML_Char **)parser->m_atts);
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        poolClear(&parser->m_tempPool);
        break;
      }
    case XML_TOK_EMPTY_ELEMENT_NO_ATTS:
      /* fall through */
    case XML_TOK_EMPTY_ELEMENT_WITH_ATTS:
      {
        const char *rawName = s + enc->minBytesPerChar;
        enum XML_Error result;
        BINDING *bindings = NULL;
        XML_Bool noElmHandlers = XML_TRUE;
        TAG_NAME name;
        name.str = poolStoreString(&parser->m_tempPool, enc, rawName,
                                   rawName + XmlNameLength(enc, rawName));
        if (!name.str)
          return XML_ERROR_NO_MEMORY;
        poolFinish(&parser->m_tempPool);
        result = storeAtts(parser, enc, s, &name, &bindings);
        if (result != XML_ERROR_NONE) {
          freeBindings(parser, bindings);
          return result;
        }
        poolFinish(&parser->m_tempPool);
        if (parser->m_startElementHandler) {
          parser->m_startElementHandler(parser->m_handlerArg, name.str, (const XML_Char **)parser->m_atts);
          noElmHandlers = XML_FALSE;
        }
        if (parser->m_endElementHandler) {
          if (parser->m_startElementHandler)
            *eventPP = *eventEndPP;
          parser->m_endElementHandler(parser->m_handlerArg, name.str);
          noElmHandlers = XML_FALSE;
        }
        if (noElmHandlers && parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        poolClear(&parser->m_tempPool);
        freeBindings(parser, bindings);
      }
      if ((parser->m_tagLevel == 0) && (parser->m_parsingStatus.parsing != XML_FINISHED)) {
        if (parser->m_parsingStatus.parsing == XML_SUSPENDED)
          parser->m_processor = epilogProcessor;
        else
          return epilogProcessor(parser, next, end, nextPtr);
      }
      break;
    case XML_TOK_END_TAG:
      if (parser->m_tagLevel == startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      else {
        int len;
        const char *rawName;
        TAG *tag = parser->m_tagStack;
        parser->m_tagStack = tag->parent;
        tag->parent = parser->m_freeTagList;
        parser->m_freeTagList = tag;
        rawName = s + enc->minBytesPerChar*2;
        len = XmlNameLength(enc, rawName);
        if (len != tag->rawNameLength
            || memcmp(tag->rawName, rawName, len) != 0) {
          *eventPP = rawName;
          return XML_ERROR_TAG_MISMATCH;
        }
        --parser->m_tagLevel;
        if (parser->m_endElementHandler) {
          const XML_Char *localPart;
          const XML_Char *prefix;
          XML_Char *uri;
          localPart = tag->name.localPart;
          if (parser->m_ns && localPart) {
            /* localPart and prefix may have been overwritten in
               tag->name.str, since this points to the binding->uri
               buffer which gets re-used; so we have to add them again
            */
            uri = (XML_Char *)tag->name.str + tag->name.uriLen;
            /* don't need to check for space - already done in storeAtts() */
            while (*localPart) *uri++ = *localPart++;
            prefix = (XML_Char *)tag->name.prefix;
            if (parser->m_ns_triplets && prefix) {
              *uri++ = parser->m_namespaceSeparator;
              while (*prefix) *uri++ = *prefix++;
             }
            *uri = XML_T('\0');
          }
          parser->m_endElementHandler(parser->m_handlerArg, tag->name.str);
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        while (tag->bindings) {
          BINDING *b = tag->bindings;
          if (parser->m_endNamespaceDeclHandler)
            parser->m_endNamespaceDeclHandler(parser->m_handlerArg, b->prefix->name);
          tag->bindings = tag->bindings->nextTagBinding;
          b->nextTagBinding = parser->m_freeBindingList;
          parser->m_freeBindingList = b;
          b->prefix->binding = b->prevPrefixBinding;
        }
        if (parser->m_tagLevel == 0)
          return epilogProcessor(parser, next, end, nextPtr);
      }
      break;
    case XML_TOK_CHAR_REF:
      {
        int n = XmlCharRefNumber(enc, s);
        if (n < 0)
          return XML_ERROR_BAD_CHAR_REF;
        if (parser->m_characterDataHandler) {
          XML_Char buf[XML_ENCODE_MAX];
          parser->m_characterDataHandler(parser->m_handlerArg, buf, XmlEncode(n, (ICHAR *)buf));
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
      }
      break;
    case XML_TOK_XML_DECL:
      return XML_ERROR_MISPLACED_XML_PI;
    case XML_TOK_DATA_NEWLINE:
      if (parser->m_characterDataHandler) {
        XML_Char c = 0xA;
        parser->m_characterDataHandler(parser->m_handlerArg, &c, 1);
      }
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_CDATA_SECT_OPEN:
      {
        enum XML_Error result;
        if (parser->m_startCdataSectionHandler)
          parser->m_startCdataSectionHandler(parser->m_handlerArg);
/* BEGIN disabled code */
        /* Suppose you doing a transformation on a document that involves
           changing only the character data.  You set up a defaultHandler
           and a characterDataHandler.  The defaultHandler simply copies
           characters through.  The characterDataHandler does the
           transformation and writes the characters out escaping them as
           necessary.  This case will fail to work if we leave out the
           following two lines (because & and < inside CDATA sections will
           be incorrectly escaped).

           However, now we have a start/endCdataSectionHandler, so it seems
           easier to let the user deal with this.
        */
        else if (0 && parser->m_characterDataHandler)
          parser->m_characterDataHandler(parser->m_handlerArg, parser->m_dataBuf, 0);
/* END disabled code */
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        result = doCdataSection(parser, enc, &next, end, nextPtr, haveMore);
        if (result != XML_ERROR_NONE)
          return result;
        else if (!next) {
          parser->m_processor = cdataSectionProcessor;
          return result;
        }
      }
      break;
    case XML_TOK_TRAILING_RSQB:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (parser->m_characterDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          ICHAR *dataPtr = (ICHAR *)parser->m_dataBuf;
          XmlConvert(enc, &s, end, &dataPtr, (ICHAR *)parser->m_dataBufEnd);
          parser->m_characterDataHandler(parser->m_handlerArg, parser->m_dataBuf,
                               (int)(dataPtr - (ICHAR *)parser->m_dataBuf));
        }
        else
          parser->m_characterDataHandler(parser->m_handlerArg,
                               (XML_Char *)s,
                               (int)((XML_Char *)end - (XML_Char *)s));
      }
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, end);
      /* We are at the end of the final buffer, should we check for
         XML_SUSPENDED, XML_FINISHED?
      */
      if (startTagLevel == 0) {
        *eventPP = end;
        return XML_ERROR_NO_ELEMENTS;
      }
      if (parser->m_tagLevel != startTagLevel) {
        *eventPP = end;
        return XML_ERROR_ASYNC_ENTITY;
      }
      *nextPtr = end;
      return XML_ERROR_NONE;
    case XML_TOK_DATA_CHARS:
      {
        XML_CharacterDataHandler charDataHandler = parser->m_characterDataHandler;
        if (charDataHandler) {
          if (MUST_CONVERT(enc, s)) {
            for (;;) {
              ICHAR *dataPtr = (ICHAR *)parser->m_dataBuf;
              const enum XML_Convert_Result convert_res = XmlConvert(enc, &s, next, &dataPtr, (ICHAR *)parser->m_dataBufEnd);
              *eventEndPP = s;
              charDataHandler(parser->m_handlerArg, parser->m_dataBuf,
                              (int)(dataPtr - (ICHAR *)parser->m_dataBuf));
              if ((convert_res == XML_CONVERT_COMPLETED) || (convert_res == XML_CONVERT_INPUT_INCOMPLETE))
                break;
              *eventPP = s;
            }
          }
          else
            charDataHandler(parser->m_handlerArg,
                            (XML_Char *)s,
                            (int)((XML_Char *)next - (XML_Char *)s));
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
      }
      break;
    case XML_TOK_PI:
      if (!reportProcessingInstruction(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_COMMENT:
      if (!reportComment(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    default:
      /* All of the tokens produced by XmlContentTok() have their own
       * explicit cases, so this default is not strictly necessary.
       * However it is a useful safety net, so we retain the code and
       * simply exclude it from the coverage tests.
       *
       * LCOV_EXCL_START
       */
      if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
      /* LCOV_EXCL_STOP */
    }
    *eventPP = s = next;
    switch (parser->m_parsingStatus.parsing) {
    case XML_SUSPENDED:
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_FINISHED:
      return XML_ERROR_ABORTED;
    default: ;
    }
  }
  /* not reached */
}